

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O2

Files * __thiscall
cmInstallTargetGenerator::GetFiles
          (Files *__return_storage_ptr__,cmInstallTargetGenerator *this,string *config)

{
  string *__lhs;
  NamelinkModeType NVar1;
  cmGeneratorTarget *this_00;
  pointer pbVar2;
  bool bVar3;
  bool bVar4;
  cmInstallType cVar5;
  cmLocalGenerator *pcVar6;
  string *psVar7;
  string *psVar8;
  cmGlobalGenerator *pcVar9;
  cmMakefile *this_01;
  cmValue cVar10;
  Names *this_02;
  string *obj;
  pointer __args;
  string to1;
  string targetNameImportLib;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  objects;
  string toSOName;
  string fromDirConfig;
  string fromRealName;
  string toRealName;
  Names targetNames;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  psVar8 = &to1;
  Files::Files(__return_storage_ptr__);
  cVar5 = cmGeneratorTarget::GetType(this->Target);
  switch(cVar5) {
  case cmInstallType_EXECUTABLE:
  case cmInstallType_STATIC_LIBRARY:
  case cmInstallType_SHARED_LIBRARY:
  case cmInstallType_MODULE_LIBRARY:
    __return_storage_ptr__->Type = cVar5;
    break;
  case cmInstallType_FILES:
    objects.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    objects.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    objects.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmGeneratorTarget::GetTargetObjectNames(this->Target,config,&objects);
    __return_storage_ptr__->Type = cmInstallType_FILES;
    __return_storage_ptr__->NoTweak = true;
    cmGeneratorTarget::GetObjectDirectory(&targetNames.Base,this->Target,config);
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->FromDir,(string *)&targetNames);
    std::__cxx11::string::~string((string *)&targetNames);
    anon_unknown.dwarf_1772651::computeInstallObjectDir(&targetNames.Base,this->Target,config);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->ToDir,(string *)&targetNames)
    ;
    std::__cxx11::string::~string((string *)&targetNames);
    pbVar2 = objects.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (__args = objects.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; __args != pbVar2; __args = __args + 1)
    {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,__args);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &__return_storage_ptr__->To,__args);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&objects);
    return __return_storage_ptr__;
  case cmInstallType_PROGRAMS:
  case cmInstallType_DIRECTORY:
  case 8:
    pcVar6 = cmGeneratorTarget::GetLocalGenerator(this->Target);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&targetNames,
               "cmInstallTargetGenerator created with non-installable target.",
               (allocator<char> *)&objects);
    cmLocalGenerator::IssueMessage(pcVar6,INTERNAL_ERROR,&targetNames.Base);
    this_02 = &targetNames;
    goto LAB_0040bee5;
  case cmInstallType_DIRECTORY|cmInstallType_STATIC_LIBRARY:
    __assert_fail("false && \"INTERFACE_LIBRARY targets have no installable outputs.\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmInstallTargetGenerator.cxx"
                  ,0x8c,
                  "cmInstallTargetGenerator::Files cmInstallTargetGenerator::GetFiles(const std::string &) const"
                 );
  }
  fromDirConfig._M_dataplus._M_p = (pointer)&fromDirConfig.field_2;
  fromDirConfig._M_string_length = 0;
  fromDirConfig.field_2._M_local_buf[0] = '\0';
  bVar3 = cmGeneratorTarget::NeedRelinkBeforeInstall(this->Target,config);
  if (bVar3) {
    pcVar6 = cmGeneratorTarget::GetLocalGenerator(this->Target);
    psVar7 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(pcVar6);
    targetNames.Base._M_string_length = (size_type)(psVar7->_M_dataplus)._M_p;
    targetNames.Base._M_dataplus._M_p = (pointer)psVar7->_M_string_length;
    objects.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1c;
    objects.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)anon_var_dwarf_176d7ab;
    cmStrCat<>(&to1,(cmAlphaNum *)&targetNames,(cmAlphaNum *)&objects);
    std::__cxx11::string::operator=((string *)&fromDirConfig,(string *)&to1);
  }
  else {
    cmGeneratorTarget::GetDirectory
              (&targetNameImportLib,this->Target,config,(uint)this->ImportLibrary);
    targetNames.Base._M_dataplus._M_p = (pointer)targetNameImportLib._M_string_length;
    targetNames.Base._M_string_length = (size_type)targetNameImportLib._M_dataplus._M_p;
    objects.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)&objects.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    objects.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_00000001;
    objects.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT71(objects.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,0x2f);
    cmStrCat<>(&to1,(cmAlphaNum *)&targetNames,(cmAlphaNum *)&objects);
    std::__cxx11::string::operator=((string *)&fromDirConfig,(string *)&to1);
    std::__cxx11::string::~string((string *)&to1);
    psVar8 = &targetNameImportLib;
  }
  std::__cxx11::string::~string((string *)psVar8);
  if (cVar5 == cmInstallType_EXECUTABLE) {
    if (this->NamelinkMode != NamelinkModeNone) {
      __assert_fail("this->NamelinkMode == NamelinkModeNone",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmInstallTargetGenerator.cxx"
                    ,0xb8,
                    "cmInstallTargetGenerator::Files cmInstallTargetGenerator::GetFiles(const std::string &) const"
                   );
    }
    cmGeneratorTarget::GetExecutableNames(&targetNames,this->Target,config);
    if (this->ImportLibrary == true) {
      psVar8 = &targetNames.ImportLibrary;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&objects,
                     &fromDirConfig,psVar8);
      std::__cxx11::string::string((string *)&to1,(string *)psVar8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&objects);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &__return_storage_ptr__->To,&to1);
      targetNameImportLib._M_dataplus._M_p = (pointer)&targetNameImportLib.field_2;
      targetNameImportLib._M_string_length = 0;
      targetNameImportLib.field_2._M_local_buf[0] = '\0';
      bVar3 = cmGeneratorTarget::GetImplibGNUtoMS
                        (this->Target,config,psVar8,&targetNameImportLib,(char *)0x0);
      if (bVar3) {
        std::operator+(&toSOName,&fromDirConfig,&targetNameImportLib);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,&toSOName);
        std::__cxx11::string::~string((string *)&toSOName);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &__return_storage_ptr__->To,&targetNameImportLib);
      }
      __return_storage_ptr__->Type = cmInstallType_STATIC_LIBRARY;
      std::__cxx11::string::~string((string *)&targetNameImportLib);
    }
    else {
      psVar8 = &targetNames.Output;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&objects,
                     &fromDirConfig,psVar8);
      std::__cxx11::string::string((string *)&to1,(string *)psVar8);
      bVar3 = cmGeneratorTarget::IsAppBundleOnApple(this->Target);
      if (bVar3) {
        this_01 = cmTarget::GetMakefile(this->Target->Target);
        targetNameImportLib._M_dataplus._M_p = (pointer)&targetNameImportLib.field_2;
        targetNameImportLib._M_string_length = 0;
        targetNameImportLib.field_2._M_local_buf[0] = '\0';
        this_00 = this->Target;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&toSOName,"BUNDLE_EXTENSION",(allocator<char> *)&fromRealName);
        cVar10 = cmGeneratorTarget::GetProperty(this_00,&toSOName);
        std::__cxx11::string::~string((string *)&toSOName);
        if (cVar10.Value == (string *)0x0) {
          std::__cxx11::string::assign((char *)&targetNameImportLib);
        }
        else {
          std::__cxx11::string::_M_assign((string *)&targetNameImportLib);
        }
        __return_storage_ptr__->Type = cmInstallType_DIRECTORY;
        __return_storage_ptr__->UseSourcePermissions = true;
        std::__cxx11::string::append((char *)&objects);
        std::__cxx11::string::append((string *)&objects);
        std::__cxx11::string::append((char *)&to1);
        std::__cxx11::string::append((string *)&to1);
        std::__cxx11::string::append((char *)&to1);
        bVar3 = cmMakefile::PlatformIsAppleEmbedded(this_01);
        if (!bVar3) {
          std::__cxx11::string::append((char *)&to1);
        }
        std::__cxx11::string::append((string *)&to1);
LAB_0040be0b:
        std::__cxx11::string::~string((string *)&targetNameImportLib);
      }
      else {
        psVar7 = &targetNames.Real;
        bVar3 = std::operator!=(psVar7,psVar8);
        if (bVar3) {
          std::operator+(&targetNameImportLib,&fromDirConfig,psVar7);
          std::__cxx11::string::string((string *)&toSOName,(string *)psVar7);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,&targetNameImportLib);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &__return_storage_ptr__->To,&toSOName);
          std::__cxx11::string::~string((string *)&toSOName);
          goto LAB_0040be0b;
        }
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&objects);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &__return_storage_ptr__->To,&to1);
    }
    std::__cxx11::string::~string((string *)&to1);
    std::__cxx11::string::~string((string *)&objects);
    cmGeneratorTarget::Names::~Names(&targetNames);
  }
  else {
    cmGeneratorTarget::GetLibraryNames(&targetNames,this->Target,config);
    if (this->ImportLibrary == true) {
      if (this->NamelinkMode != NamelinkModeNone) {
        __assert_fail("this->NamelinkMode == NamelinkModeNone",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmInstallTargetGenerator.cxx"
                      ,0xfa,
                      "cmInstallTargetGenerator::Files cmInstallTargetGenerator::GetFiles(const std::string &) const"
                     );
      }
      psVar8 = &targetNames.ImportLibrary;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&objects,
                     &fromDirConfig,psVar8);
      std::__cxx11::string::string((string *)&to1,(string *)psVar8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&objects);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &__return_storage_ptr__->To,&to1);
      targetNameImportLib._M_dataplus._M_p = (pointer)&targetNameImportLib.field_2;
      targetNameImportLib._M_string_length = 0;
      targetNameImportLib.field_2._M_local_buf[0] = '\0';
      bVar3 = cmGeneratorTarget::GetImplibGNUtoMS
                        (this->Target,config,psVar8,&targetNameImportLib,(char *)0x0);
      if (bVar3) {
        std::operator+(&toSOName,&fromDirConfig,&targetNameImportLib);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,&toSOName);
        std::__cxx11::string::~string((string *)&toSOName);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &__return_storage_ptr__->To,&targetNameImportLib);
      }
      __return_storage_ptr__->Type = cmInstallType_STATIC_LIBRARY;
LAB_0040be96:
      std::__cxx11::string::~string((string *)&targetNameImportLib);
LAB_0040bea0:
      std::__cxx11::string::~string((string *)&to1);
      std::__cxx11::string::~string((string *)&objects);
      bVar3 = true;
      bVar4 = false;
    }
    else {
      bVar3 = cmGeneratorTarget::IsFrameworkOnApple(this->Target);
      if (!bVar3) {
        bVar3 = cmGeneratorTarget::IsCFBundleOnApple(this->Target);
        if (bVar3) {
          __return_storage_ptr__->Type = cmInstallType_DIRECTORY;
          __return_storage_ptr__->UseSourcePermissions = true;
          psVar8 = &targetNames.Output;
          std::__cxx11::string::find((char)psVar8,0x2f);
          std::__cxx11::string::substr((ulong)&objects,(ulong)psVar8);
          std::operator+(&to1,&fromDirConfig,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &objects);
          std::__cxx11::string::string((string *)&targetNameImportLib,(string *)psVar8);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,&to1);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &__return_storage_ptr__->To,&targetNameImportLib);
          goto LAB_0040be96;
        }
        psVar8 = &targetNames.Output;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&objects
                       ,&fromDirConfig,psVar8);
        std::__cxx11::string::string((string *)&to1,(string *)psVar8);
        targetNameImportLib._M_dataplus._M_p = (pointer)&targetNameImportLib.field_2;
        targetNameImportLib._M_string_length = 0;
        toSOName._M_dataplus._M_p = (pointer)&toSOName.field_2;
        toSOName._M_string_length = 0;
        targetNameImportLib.field_2._M_local_buf[0] = '\0';
        toSOName.field_2._M_local_buf[0] = '\0';
        psVar7 = &targetNames.SharedObject;
        bVar3 = std::operator!=(psVar7,psVar8);
        if (bVar3) {
          std::operator+(&fromRealName,&fromDirConfig,psVar7);
          std::__cxx11::string::operator=((string *)&targetNameImportLib,(string *)&fromRealName);
          std::__cxx11::string::~string((string *)&fromRealName);
          std::__cxx11::string::_M_assign((string *)&toSOName);
        }
        fromRealName._M_dataplus._M_p = (pointer)&fromRealName.field_2;
        fromRealName._M_string_length = 0;
        toRealName._M_dataplus._M_p = (pointer)&toRealName.field_2;
        toRealName._M_string_length = 0;
        fromRealName.field_2._M_local_buf[0] = '\0';
        toRealName.field_2._M_local_buf[0] = '\0';
        __lhs = &targetNames.Real;
        bVar4 = std::operator!=(__lhs,psVar8);
        if ((bVar4) && (bVar4 = std::operator!=(__lhs,psVar7), bVar4)) {
          std::operator+(&local_50,&fromDirConfig,__lhs);
          std::__cxx11::string::operator=((string *)&fromRealName,(string *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::_M_assign((string *)&toRealName);
LAB_0040bcfe:
          NVar1 = this->NamelinkMode;
          __return_storage_ptr__->NamelinkMode = NVar1;
          if (NVar1 == NamelinkModeOnly) goto LAB_0040be59;
          if (fromRealName._M_string_length != 0) {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       __return_storage_ptr__,&fromRealName);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &__return_storage_ptr__->To,&toRealName);
          }
          if (targetNameImportLib._M_string_length != 0) {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       __return_storage_ptr__,&targetNameImportLib);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &__return_storage_ptr__->To,&toSOName);
          }
          if (this->NamelinkMode != NamelinkModeSkip) goto LAB_0040be59;
        }
        else {
          if (bVar3) goto LAB_0040bcfe;
          if (this->NamelinkMode == NamelinkModeOnly) goto LAB_0040be72;
LAB_0040be59:
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&objects);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &__return_storage_ptr__->To,&to1);
        }
LAB_0040be72:
        std::__cxx11::string::~string((string *)&toRealName);
        std::__cxx11::string::~string((string *)&fromRealName);
        std::__cxx11::string::~string((string *)&toSOName);
        goto LAB_0040be96;
      }
      if (this->NamelinkMode != NamelinkModeOnly) {
        if (this->NamelinkMode == NamelinkModeSkip) {
          psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
          std::operator+(&to1,"Target \'",psVar8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &objects,&to1,
                         "\' was changed to a FRAMEWORK sometime after install().  This may result in the wrong install DESTINATION.  Set the FRAMEWORK property earlier."
                        );
          std::__cxx11::string::~string((string *)&to1);
          pcVar9 = cmGeneratorTarget::GetGlobalGenerator(this->Target);
          cmake::IssueMessage(pcVar9->CMakeInstance,AUTHOR_WARNING,(string *)&objects,
                              &(this->super_cmInstallGenerator).Backtrace);
          std::__cxx11::string::~string((string *)&objects);
        }
        __return_storage_ptr__->Type = cmInstallType_DIRECTORY;
        __return_storage_ptr__->UseSourcePermissions = true;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&objects
                       ,&fromDirConfig,&targetNames.Output);
        cmsys::SystemTools::GetFilenamePath(&to1,(string *)&objects);
        std::__cxx11::string::operator=((string *)&objects,(string *)&to1);
        std::__cxx11::string::~string((string *)&to1);
        std::__cxx11::string::string((string *)&to1,(string *)&targetNames.Real);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&objects);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &__return_storage_ptr__->To,&to1);
        goto LAB_0040bea0;
      }
      bVar4 = true;
      bVar3 = false;
    }
    cmGeneratorTarget::Names::~Names(&targetNames);
    if (!bVar3) {
      std::__cxx11::string::~string((string *)&fromDirConfig);
      if (bVar4) {
        return __return_storage_ptr__;
      }
      Files::~Files(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
  }
  if ((long)(__return_storage_ptr__->From).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(__return_storage_ptr__->From).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
      (long)(__return_storage_ptr__->To).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(__return_storage_ptr__->To).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
    __assert_fail("files.From.size() == files.To.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmInstallTargetGenerator.cxx"
                  ,0x181,
                  "cmInstallTargetGenerator::Files cmInstallTargetGenerator::GetFiles(const std::string &) const"
                 );
  }
  this_02 = (Names *)&fromDirConfig;
LAB_0040bee5:
  std::__cxx11::string::~string((string *)this_02);
  return __return_storage_ptr__;
}

Assistant:

cmInstallTargetGenerator::Files cmInstallTargetGenerator::GetFiles(
  std::string const& config) const
{
  Files files;

  cmStateEnums::TargetType targetType = this->Target->GetType();
  switch (targetType) {
    case cmStateEnums::EXECUTABLE:
      files.Type = cmInstallType_EXECUTABLE;
      break;
    case cmStateEnums::STATIC_LIBRARY:
      files.Type = cmInstallType_STATIC_LIBRARY;
      break;
    case cmStateEnums::SHARED_LIBRARY:
      files.Type = cmInstallType_SHARED_LIBRARY;
      break;
    case cmStateEnums::MODULE_LIBRARY:
      files.Type = cmInstallType_MODULE_LIBRARY;
      break;
    case cmStateEnums::INTERFACE_LIBRARY:
      // Not reachable. We never create a cmInstallTargetGenerator for
      // an INTERFACE_LIBRARY.
      assert(false &&
             "INTERFACE_LIBRARY targets have no installable outputs.");
      break;

    case cmStateEnums::OBJECT_LIBRARY: {
      // Compute all the object files inside this target
      std::vector<std::string> objects;
      this->Target->GetTargetObjectNames(config, objects);

      files.Type = cmInstallType_FILES;
      files.NoTweak = true;
      files.FromDir = this->Target->GetObjectDirectory(config);
      files.ToDir = computeInstallObjectDir(this->Target, config);
      for (std::string& obj : objects) {
        files.From.emplace_back(obj);
        files.To.emplace_back(std::move(obj));
      }
      return files;
    }

    case cmStateEnums::UTILITY:
    case cmStateEnums::GLOBAL_TARGET:
    case cmStateEnums::UNKNOWN_LIBRARY:
      this->Target->GetLocalGenerator()->IssueMessage(
        MessageType::INTERNAL_ERROR,
        "cmInstallTargetGenerator created with non-installable target.");
      return files;
  }

  // Compute the build tree directory from which to copy the target.
  std::string fromDirConfig;
  if (this->Target->NeedRelinkBeforeInstall(config)) {
    fromDirConfig =
      cmStrCat(this->Target->GetLocalGenerator()->GetCurrentBinaryDirectory(),
               "/CMakeFiles/CMakeRelink.dir/");
  } else {
    cmStateEnums::ArtifactType artifact = this->ImportLibrary
      ? cmStateEnums::ImportLibraryArtifact
      : cmStateEnums::RuntimeBinaryArtifact;
    fromDirConfig =
      cmStrCat(this->Target->GetDirectory(config, artifact), '/');
  }

  if (targetType == cmStateEnums::EXECUTABLE) {
    // There is a bug in cmInstallCommand if this fails.
    assert(this->NamelinkMode == NamelinkModeNone);

    cmGeneratorTarget::Names targetNames =
      this->Target->GetExecutableNames(config);
    if (this->ImportLibrary) {
      std::string from1 = fromDirConfig + targetNames.ImportLibrary;
      std::string to1 = targetNames.ImportLibrary;
      files.From.emplace_back(std::move(from1));
      files.To.emplace_back(std::move(to1));
      std::string targetNameImportLib;
      if (this->Target->GetImplibGNUtoMS(config, targetNames.ImportLibrary,
                                         targetNameImportLib)) {
        files.From.emplace_back(fromDirConfig + targetNameImportLib);
        files.To.emplace_back(targetNameImportLib);
      }

      // An import library looks like a static library.
      files.Type = cmInstallType_STATIC_LIBRARY;
    } else {
      std::string from1 = fromDirConfig + targetNames.Output;
      std::string to1 = targetNames.Output;

      // Handle OSX Bundles.
      if (this->Target->IsAppBundleOnApple()) {
        cmMakefile const* mf = this->Target->Target->GetMakefile();

        // Get App Bundle Extension
        std::string ext;
        if (cmValue p = this->Target->GetProperty("BUNDLE_EXTENSION")) {
          ext = *p;
        } else {
          ext = "app";
        }

        // Install the whole app bundle directory.
        files.Type = cmInstallType_DIRECTORY;
        files.UseSourcePermissions = true;
        from1 += ".";
        from1 += ext;

        // Tweaks apply to the binary inside the bundle.
        to1 += ".";
        to1 += ext;
        to1 += "/";
        if (!mf->PlatformIsAppleEmbedded()) {
          to1 += "Contents/MacOS/";
        }
        to1 += targetNames.Output;
      } else {
        // Tweaks apply to the real file, so list it first.
        if (targetNames.Real != targetNames.Output) {
          std::string from2 = fromDirConfig + targetNames.Real;
          std::string to2 = targetNames.Real;
          files.From.emplace_back(std::move(from2));
          files.To.emplace_back(std::move(to2));
        }
      }

      files.From.emplace_back(std::move(from1));
      files.To.emplace_back(std::move(to1));
    }
  } else {
    cmGeneratorTarget::Names targetNames =
      this->Target->GetLibraryNames(config);
    if (this->ImportLibrary) {
      // There is a bug in cmInstallCommand if this fails.
      assert(this->NamelinkMode == NamelinkModeNone);

      std::string from1 = fromDirConfig + targetNames.ImportLibrary;
      std::string to1 = targetNames.ImportLibrary;
      files.From.emplace_back(std::move(from1));
      files.To.emplace_back(std::move(to1));
      std::string targetNameImportLib;
      if (this->Target->GetImplibGNUtoMS(config, targetNames.ImportLibrary,
                                         targetNameImportLib)) {
        files.From.emplace_back(fromDirConfig + targetNameImportLib);
        files.To.emplace_back(targetNameImportLib);
      }

      // An import library looks like a static library.
      files.Type = cmInstallType_STATIC_LIBRARY;
    } else if (this->Target->IsFrameworkOnApple()) {
      // FIXME: In principle we should be able to
      //   assert(this->NamelinkMode == NamelinkModeNone);
      // but since the current install() command implementation checks
      // the FRAMEWORK property immediately instead of delaying until
      // generate time, it is possible for project code to set the
      // property after calling install().  In such a case, the install()
      // command will use the LIBRARY code path and create two install
      // generators, one for the namelink component (NamelinkModeOnly)
      // and one for the primary artifact component (NamelinkModeSkip).
      // Historically this was not diagnosed and resulted in silent
      // installation of a framework to the LIBRARY destination.
      // Retain that behavior and warn about the case.
      switch (this->NamelinkMode) {
        case NamelinkModeNone:
          // Normal case.
          break;
        case NamelinkModeOnly:
          // Assume the NamelinkModeSkip instance will warn and install.
          return files;
        case NamelinkModeSkip: {
          std::string e = "Target '" + this->Target->GetName() +
            "' was changed to a FRAMEWORK sometime after install().  "
            "This may result in the wrong install DESTINATION.  "
            "Set the FRAMEWORK property earlier.";
          this->Target->GetGlobalGenerator()->GetCMakeInstance()->IssueMessage(
            MessageType::AUTHOR_WARNING, e, this->GetBacktrace());
        } break;
      }

      // Install the whole framework directory.
      files.Type = cmInstallType_DIRECTORY;
      files.UseSourcePermissions = true;

      std::string from1 = fromDirConfig + targetNames.Output;
      from1 = cmSystemTools::GetFilenamePath(from1);

      // Tweaks apply to the binary inside the bundle.
      std::string to1 = targetNames.Real;

      files.From.emplace_back(std::move(from1));
      files.To.emplace_back(std::move(to1));
    } else if (this->Target->IsCFBundleOnApple()) {
      // Install the whole app bundle directory.
      files.Type = cmInstallType_DIRECTORY;
      files.UseSourcePermissions = true;

      std::string targetNameBase =
        targetNames.Output.substr(0, targetNames.Output.find('/'));

      std::string from1 = fromDirConfig + targetNameBase;
      std::string to1 = targetNames.Output;

      files.From.emplace_back(std::move(from1));
      files.To.emplace_back(std::move(to1));
    } else {
      bool haveNamelink = false;

      // Library link name.
      std::string fromName = fromDirConfig + targetNames.Output;
      std::string toName = targetNames.Output;

      // Library interface name.
      std::string fromSOName;
      std::string toSOName;
      if (targetNames.SharedObject != targetNames.Output) {
        haveNamelink = true;
        fromSOName = fromDirConfig + targetNames.SharedObject;
        toSOName = targetNames.SharedObject;
      }

      // Library implementation name.
      std::string fromRealName;
      std::string toRealName;
      if (targetNames.Real != targetNames.Output &&
          targetNames.Real != targetNames.SharedObject) {
        haveNamelink = true;
        fromRealName = fromDirConfig + targetNames.Real;
        toRealName = targetNames.Real;
      }

      // Add the names based on the current namelink mode.
      if (haveNamelink) {
        files.NamelinkMode = this->NamelinkMode;
        // With a namelink we need to check the mode.
        if (this->NamelinkMode == NamelinkModeOnly) {
          // Install the namelink only.
          files.From.emplace_back(fromName);
          files.To.emplace_back(toName);
        } else {
          // Install the real file if it has its own name.
          if (!fromRealName.empty()) {
            files.From.emplace_back(fromRealName);
            files.To.emplace_back(toRealName);
          }

          // Install the soname link if it has its own name.
          if (!fromSOName.empty()) {
            files.From.emplace_back(fromSOName);
            files.To.emplace_back(toSOName);
          }

          // Install the namelink if it is not to be skipped.
          if (this->NamelinkMode != NamelinkModeSkip) {
            files.From.emplace_back(fromName);
            files.To.emplace_back(toName);
          }
        }
      } else {
        // Without a namelink there will be only one file.  Install it
        // if this is not a namelink-only rule.
        if (this->NamelinkMode != NamelinkModeOnly) {
          files.From.emplace_back(fromName);
          files.To.emplace_back(toName);
        }
      }
    }
  }

  // If this fails the above code is buggy.
  assert(files.From.size() == files.To.size());

  return files;
}